

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DrawBuffersIndexedTest::DrawBuffersIndexedTest
          (DrawBuffersIndexedTest *this,Context *context,BlendState *preCommonBlendState,
          BlendState *postCommonBlendState,
          vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
          *drawBuffers,string *name,string *description)

{
  SeparateBlendEq *pSVar1;
  BlendFunc *pBVar2;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<bool,_4>_>_2 *paVar3;
  bool bVar4;
  bool *pbVar5;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar6;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar7;
  BlendFunc *pBVar8;
  Vector<bool,_4> *pVVar9;
  pointer pDVar10;
  BlendFunc BVar11;
  DrawBufferInfo *__cur;
  pointer pDVar12;
  pointer pDVar13;
  long lVar14;
  TestContext *testCtx;
  
  testCtx = context->m_testCtx;
  tcu::TestCase::TestCase
            ((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawBuffersIndexedTest_00b58be0;
  (this->m_preCommonBlendState).enableBlend.m_ptr = (bool *)0x0;
  pbVar5 = (preCommonBlendState->enableBlend).m_ptr;
  if (pbVar5 != (bool *)0x0) {
    (this->m_preCommonBlendState).enableBlend.field_1.m_data[0] = *pbVar5;
    (this->m_preCommonBlendState).enableBlend.m_ptr =
         (bool *)&(this->m_preCommonBlendState).enableBlend.field_1;
  }
  (this->m_preCommonBlendState).blendEq.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  pEVar6 = (preCommonBlendState->blendEq).m_ptr;
  if (pEVar6 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    bVar4 = pEVar6->m_isFirst;
    testCtx = (TestContext *)CONCAT71((int7)((ulong)testCtx >> 8),bVar4);
    (this->m_preCommonBlendState).blendEq.field_1.m_data[0] = bVar4;
    pSVar1 = (SeparateBlendEq *)((long)&(this->m_preCommonBlendState).blendEq.field_1 + 0x10);
    if (bVar4 == true) {
      pSVar1->rgb = ((pEVar6->field_1).m_second)->rgb;
    }
    else {
      *pSVar1 = *(pEVar6->field_1).m_second;
    }
    *(SeparateBlendEq **)((long)&(this->m_preCommonBlendState).blendEq.field_1 + 8) = pSVar1;
    (this->m_preCommonBlendState).blendEq.m_ptr =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         &(this->m_preCommonBlendState).blendEq.field_1;
  }
  (this->m_preCommonBlendState).blendFunc.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  pEVar7 = (preCommonBlendState->blendFunc).m_ptr;
  if (pEVar7 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    bVar4 = pEVar7->m_isFirst;
    testCtx = (TestContext *)CONCAT71((int7)((ulong)testCtx >> 8),bVar4);
    (this->m_preCommonBlendState).blendFunc.field_1.m_data[0] = bVar4;
    pBVar2 = (BlendFunc *)((long)&(this->m_preCommonBlendState).blendFunc.field_1 + 0x10);
    pBVar8 = (pEVar7->field_1).m_first;
    if (bVar4 == true) {
      *pBVar2 = *pBVar8;
    }
    else {
      BVar11 = pBVar8[1];
      *pBVar2 = *pBVar8;
      *(BlendFunc *)((long)&(this->m_preCommonBlendState).blendFunc.field_1 + 0x18) = BVar11;
    }
    *(BlendFunc **)((long)&(this->m_preCommonBlendState).blendFunc.field_1 + 8) = pBVar2;
    (this->m_preCommonBlendState).blendFunc.m_ptr =
         (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
          *)&(this->m_preCommonBlendState).blendFunc.field_1;
  }
  (this->m_preCommonBlendState).colorMask.m_ptr = (Vector<bool,_4> *)0x0;
  pVVar9 = (preCommonBlendState->colorMask).m_ptr;
  if (pVVar9 != (Vector<bool,_4> *)0x0) {
    paVar3 = &(this->m_preCommonBlendState).colorMask.field_1;
    lVar14 = 0;
    do {
      bVar4 = pVVar9->m_data[lVar14];
      testCtx = (TestContext *)CONCAT71((int7)((ulong)testCtx >> 8),bVar4);
      paVar3->m_data[lVar14] = bVar4;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    (this->m_preCommonBlendState).colorMask.m_ptr = (Vector<bool,_4> *)paVar3;
  }
  (this->m_postCommonBlendState).enableBlend.m_ptr = (bool *)0x0;
  pbVar5 = (postCommonBlendState->enableBlend).m_ptr;
  if (pbVar5 != (bool *)0x0) {
    (this->m_postCommonBlendState).enableBlend.field_1.m_data[0] = *pbVar5;
    (this->m_postCommonBlendState).enableBlend.m_ptr =
         (bool *)&(this->m_postCommonBlendState).enableBlend.field_1;
  }
  (this->m_postCommonBlendState).blendEq.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  pEVar6 = (postCommonBlendState->blendEq).m_ptr;
  if (pEVar6 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    bVar4 = pEVar6->m_isFirst;
    testCtx = (TestContext *)CONCAT71((int7)((ulong)testCtx >> 8),bVar4);
    (this->m_postCommonBlendState).blendEq.field_1.m_data[0] = bVar4;
    pSVar1 = (SeparateBlendEq *)((long)&(this->m_postCommonBlendState).blendEq.field_1 + 0x10);
    if (bVar4 == true) {
      pSVar1->rgb = ((pEVar6->field_1).m_second)->rgb;
    }
    else {
      *pSVar1 = *(pEVar6->field_1).m_second;
    }
    *(SeparateBlendEq **)((long)&(this->m_postCommonBlendState).blendEq.field_1 + 8) = pSVar1;
    (this->m_postCommonBlendState).blendEq.m_ptr =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         &(this->m_postCommonBlendState).blendEq.field_1;
  }
  (this->m_postCommonBlendState).blendFunc.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  pEVar7 = (postCommonBlendState->blendFunc).m_ptr;
  if (pEVar7 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    bVar4 = pEVar7->m_isFirst;
    testCtx = (TestContext *)CONCAT71((int7)((ulong)testCtx >> 8),bVar4);
    (this->m_postCommonBlendState).blendFunc.field_1.m_data[0] = bVar4;
    pBVar2 = (BlendFunc *)((long)&(this->m_postCommonBlendState).blendFunc.field_1 + 0x10);
    pBVar8 = (pEVar7->field_1).m_first;
    if (bVar4 == true) {
      *pBVar2 = *pBVar8;
    }
    else {
      BVar11 = pBVar8[1];
      *pBVar2 = *pBVar8;
      *(BlendFunc *)((long)&(this->m_postCommonBlendState).blendFunc.field_1 + 0x18) = BVar11;
    }
    *(BlendFunc **)((long)&(this->m_postCommonBlendState).blendFunc.field_1 + 8) = pBVar2;
    (this->m_postCommonBlendState).blendFunc.m_ptr =
         (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
          *)&(this->m_postCommonBlendState).blendFunc.field_1;
  }
  (this->m_postCommonBlendState).colorMask.m_ptr = (Vector<bool,_4> *)0x0;
  pVVar9 = (postCommonBlendState->colorMask).m_ptr;
  if (pVVar9 != (Vector<bool,_4> *)0x0) {
    paVar3 = &(this->m_postCommonBlendState).colorMask.field_1;
    lVar14 = 0;
    do {
      bVar4 = pVVar9->m_data[lVar14];
      testCtx = (TestContext *)CONCAT71((int7)((ulong)testCtx >> 8),bVar4);
      paVar3->m_data[lVar14] = bVar4;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    (this->m_postCommonBlendState).colorMask.m_ptr = (Vector<bool,_4> *)paVar3;
  }
  lVar14 = (long)(drawBuffers->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(drawBuffers->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  (this->m_drawBuffers).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_drawBuffers).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_drawBuffers).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar12 = std::
            _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           *)(lVar14 >> 7),(size_t)testCtx);
  (this->m_drawBuffers).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar12;
  (this->m_drawBuffers).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar12;
  (this->m_drawBuffers).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar14 + (long)pDVar12);
  pDVar10 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (pDVar13 = (drawBuffers->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start; pDVar13 != pDVar10;
      pDVar13 = pDVar13 + 1) {
    pDVar12->m_render = pDVar13->m_render;
    lVar14 = 1;
    do {
      (pDVar12->m_size).m_data[lVar14 + -1] = (pDVar13->m_size).m_data[lVar14 + -1];
      lVar14 = lVar14 + 1;
    } while (lVar14 == 2);
    pDVar12->m_format = pDVar13->m_format;
    (pDVar12->m_blendState).enableBlend.m_ptr = (bool *)0x0;
    pbVar5 = (pDVar13->m_blendState).enableBlend.m_ptr;
    if (pbVar5 != (bool *)0x0) {
      (pDVar12->m_blendState).enableBlend.field_1.m_data[0] = *pbVar5;
      (pDVar12->m_blendState).enableBlend.m_ptr =
           (bool *)&(pDVar12->m_blendState).enableBlend.field_1;
    }
    (pDVar12->m_blendState).blendEq.m_ptr =
         (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
         0x0;
    pEVar6 = (pDVar13->m_blendState).blendEq.m_ptr;
    if (pEVar6 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                   *)0x0) {
      bVar4 = pEVar6->m_isFirst;
      (pDVar12->m_blendState).blendEq.field_1.m_data[0] = bVar4;
      pSVar1 = (SeparateBlendEq *)((long)&(pDVar12->m_blendState).blendEq.field_1 + 0x10);
      if (bVar4 == true) {
        pSVar1->rgb = ((pEVar6->field_1).m_second)->rgb;
      }
      else {
        *pSVar1 = *(pEVar6->field_1).m_second;
      }
      *(SeparateBlendEq **)((long)&(pDVar12->m_blendState).blendEq.field_1 + 8) = pSVar1;
      (pDVar12->m_blendState).blendEq.m_ptr =
           (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *
           )&(pDVar12->m_blendState).blendEq.field_1;
    }
    (pDVar12->m_blendState).blendFunc.m_ptr =
         (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
          *)0x0;
    pEVar7 = (pDVar13->m_blendState).blendFunc.m_ptr;
    if (pEVar7 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      bVar4 = pEVar7->m_isFirst;
      (pDVar12->m_blendState).blendFunc.field_1.m_data[0] = bVar4;
      pBVar2 = (BlendFunc *)((long)&(pDVar12->m_blendState).blendFunc.field_1 + 0x10);
      pBVar8 = (pEVar7->field_1).m_first;
      if (bVar4 == true) {
        *pBVar2 = *pBVar8;
      }
      else {
        BVar11 = pBVar8[1];
        *pBVar2 = *pBVar8;
        *(BlendFunc *)((long)&(pDVar12->m_blendState).blendFunc.field_1 + 0x18) = BVar11;
      }
      *(BlendFunc **)((long)&(pDVar12->m_blendState).blendFunc.field_1 + 8) = pBVar2;
      (pDVar12->m_blendState).blendFunc.m_ptr =
           (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
            *)&(pDVar12->m_blendState).blendFunc.field_1;
    }
    (pDVar12->m_blendState).colorMask.m_ptr = (Vector<bool,_4> *)0x0;
    pVVar9 = (pDVar13->m_blendState).colorMask.m_ptr;
    if (pVVar9 != (Vector<bool,_4> *)0x0) {
      lVar14 = 0;
      do {
        *(bool *)((long)(&pDVar12->m_size + 0xe) + lVar14 + 4) = pVVar9->m_data[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      (pDVar12->m_blendState).colorMask.m_ptr =
           (Vector<bool,_4> *)&(pDVar12->m_blendState).colorMask.field_1;
    }
    pDVar12 = pDVar12 + 1;
  }
  (this->m_drawBuffers).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar12;
  return;
}

Assistant:

DrawBuffersIndexedTest::DrawBuffersIndexedTest (Context&						context,
												const BlendState&				preCommonBlendState,
												const BlendState&				postCommonBlendState,
												const vector<DrawBufferInfo>&	drawBuffers,
												const string&					name,
												const string&					description)
	: TestCase					(context, name.c_str(), description.c_str())
	, m_preCommonBlendState		(preCommonBlendState)
	, m_postCommonBlendState	(postCommonBlendState)
	, m_drawBuffers				(drawBuffers)
{
}